

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cal_inertial_and_magnetic_data.cpp
# Opt level: O0

void __thiscall
ximu::CalInertialAndMagneticData::CalInertialAndMagneticData
          (CalInertialAndMagneticData *this,Vector3f *gyroscope,Vector3f *accelerometer,
          Vector3f *magnetometer)

{
  Vector3f *magnetometer_local;
  Vector3f *accelerometer_local;
  Vector3f *gyroscope_local;
  CalInertialAndMagneticData *this_local;
  
  Vector3<float>::Vector3(&this->_gyroscope,gyroscope);
  Vector3<float>::Vector3(&this->_accelerometer,accelerometer);
  Vector3<float>::Vector3(&this->_magnetometer,magnetometer);
  return;
}

Assistant:

CalInertialAndMagneticData::CalInertialAndMagneticData(
     const Vector3f& gyroscope,
     const Vector3f& accelerometer,
     const Vector3f& magnetometer)
    :
    _gyroscope(gyroscope),
    _accelerometer(accelerometer),
    _magnetometer(magnetometer) {
}